

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void __thiscall
SimpleString::split(SimpleString *this,SimpleString *delimiter,SimpleStringCollection *col)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  SimpleString *pSVar4;
  char *otherBuffer;
  SimpleString local_50;
  SimpleStringCollection *local_48;
  size_t local_40;
  SimpleString local_38;
  
  sVar2 = count(this,delimiter);
  bVar1 = endsWith(this,delimiter);
  local_48 = col;
  local_40 = sVar2;
  SimpleStringCollection::allocate(col,!bVar1 + sVar2);
  otherBuffer = this->buffer_;
  for (sVar2 = 0; local_40 != sVar2; sVar2 = sVar2 + 1) {
    pcVar3 = StrStr(otherBuffer,delimiter->buffer_);
    SimpleString(&local_38,otherBuffer);
    subString(&local_50,(size_t)&local_38,0);
    pSVar4 = SimpleStringCollection::operator[](local_48,sVar2);
    operator=(pSVar4,&local_50);
    ~SimpleString(&local_50);
    ~SimpleString(&local_38);
    otherBuffer = pcVar3 + 1;
  }
  if (!bVar1) {
    SimpleString(&local_50,otherBuffer);
    pSVar4 = SimpleStringCollection::operator[](local_48,local_40);
    operator=(pSVar4,&local_50);
    ~SimpleString(&local_50);
  }
  return;
}

Assistant:

void SimpleString::split(const SimpleString& delimiter, SimpleStringCollection& col) const
{
    size_t num = count(delimiter);
    size_t extraEndToken = (endsWith(delimiter)) ? 0 : 1U;
    col.allocate(num + extraEndToken);

    char* str = buffer_;
    char* prev;
    for (size_t i = 0; i < num; ++i) {
        prev = str;
        str = StrStr(str, delimiter.buffer_) + 1;
        col[i] = SimpleString(prev).subString(0, size_t (str - prev));
    }
    if (extraEndToken) {
        col[num] = str;
    }
}